

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  ulong uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  UVIdentity<4> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_14b9;
  float local_14b8;
  int local_14b4;
  Ray *local_14b0;
  RTCIntersectArguments *local_14a8;
  RayQueryContext *local_14a0;
  Geometry *local_1498;
  ulong local_1490;
  ulong local_1488;
  Scene *local_1480;
  ulong local_1478;
  ulong *local_1470;
  long local_1468;
  long local_1460;
  undefined4 local_1458;
  undefined4 local_1454;
  undefined4 local_1450;
  undefined4 local_144c;
  undefined4 local_1448;
  undefined4 local_1444;
  uint local_1440;
  uint local_143c;
  uint local_1438;
  RTCFilterFunctionNArguments local_1428;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 *local_13a8;
  byte local_13a0;
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar61 = ray->tfar;
    if (0.0 <= fVar61) {
      puVar22 = local_11d8 + 1;
      aVar3 = (ray->dir).field_0;
      auVar47 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar26._8_4_ = 0x7fffffff;
      auVar26._0_8_ = 0x7fffffff7fffffff;
      auVar26._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx512vl((undefined1  [16])aVar3,auVar26);
      auVar27._8_4_ = 0x219392ef;
      auVar27._0_8_ = 0x219392ef219392ef;
      auVar27._12_4_ = 0x219392ef;
      uVar21 = vcmpps_avx512vl(auVar26,auVar27,1);
      auVar26 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar68 = ZEXT1664(auVar26);
      auVar26 = vdivps_avx512vl(auVar26,(undefined1  [16])aVar3);
      auVar27 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar9 = (bool)((byte)uVar21 & 1);
      auVar31._0_4_ = (uint)bVar9 * auVar27._0_4_ | (uint)!bVar9 * auVar26._0_4_;
      bVar9 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar31._4_4_ = (uint)bVar9 * auVar27._4_4_ | (uint)!bVar9 * auVar26._4_4_;
      bVar9 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar31._8_4_ = (uint)bVar9 * auVar27._8_4_ | (uint)!bVar9 * auVar26._8_4_;
      bVar9 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar31._12_4_ = (uint)bVar9 * auVar27._12_4_ | (uint)!bVar9 * auVar26._12_4_;
      auVar28._8_4_ = 0x3f7ffffa;
      auVar28._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar28._12_4_ = 0x3f7ffffa;
      auVar28 = vmulps_avx512vl(auVar31,auVar28);
      auVar29._8_4_ = 0x3f800003;
      auVar29._0_8_ = 0x3f8000033f800003;
      auVar29._12_4_ = 0x3f800003;
      auVar29 = vmulps_avx512vl(auVar31,auVar29);
      auVar48 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar69 = ZEXT3264(auVar48);
      auVar48 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar70 = ZEXT3264(auVar48);
      auVar48 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar71 = ZEXT3264(auVar48);
      auVar48 = vbroadcastss_avx512vl(auVar28);
      auVar72 = ZEXT3264(auVar48);
      auVar26 = vmovshdup_avx(auVar28);
      auVar48 = vbroadcastsd_avx512vl(auVar26);
      auVar73 = ZEXT3264(auVar48);
      auVar49._8_4_ = 2;
      auVar49._0_8_ = 0x200000002;
      auVar49._12_4_ = 2;
      auVar49._16_4_ = 2;
      auVar49._20_4_ = 2;
      auVar49._24_4_ = 2;
      auVar49._28_4_ = 2;
      auVar27 = vshufpd_avx(auVar28,auVar28,1);
      local_11f8 = vpermps_avx2(auVar49,ZEXT1632(auVar28));
      auVar60 = ZEXT3264(local_11f8);
      fVar51 = auVar29._0_4_;
      auVar48._8_4_ = 1;
      auVar48._0_8_ = 0x100000001;
      auVar48._12_4_ = 1;
      auVar48._16_4_ = 1;
      auVar48._20_4_ = 1;
      auVar48._24_4_ = 1;
      auVar48._28_4_ = 1;
      local_1238 = vpermps_avx2(auVar48,ZEXT1632(auVar29));
      auVar55 = ZEXT3264(local_1238);
      local_1258 = vpermps_avx2(auVar49,ZEXT1632(auVar29));
      auVar58 = ZEXT3264(local_1258);
      local_1478 = (ulong)(auVar28._0_4_ < 0.0) << 5;
      uVar23 = (ulong)(auVar26._0_4_ < 0.0) << 5 | 0x40;
      uVar21 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x80;
      uVar24 = local_1478 ^ 0x20;
      local_1278._0_4_ = auVar47._0_4_;
      local_1278._4_4_ = local_1278._0_4_;
      local_1278._8_4_ = local_1278._0_4_;
      local_1278._12_4_ = local_1278._0_4_;
      local_1278._16_4_ = local_1278._0_4_;
      local_1278._20_4_ = local_1278._0_4_;
      local_1278._24_4_ = local_1278._0_4_;
      local_1278._28_4_ = local_1278._0_4_;
      auVar54 = ZEXT3264(local_1278);
      local_1298._4_4_ = fVar61;
      local_1298._0_4_ = fVar61;
      local_1298._8_4_ = fVar61;
      local_1298._12_4_ = fVar61;
      local_1298._16_4_ = fVar61;
      local_1298._20_4_ = fVar61;
      local_1298._24_4_ = fVar61;
      local_1298._28_4_ = fVar61;
      auVar57 = ZEXT3264(local_1298);
      local_14a0 = context;
      local_1218 = fVar51;
      fStack_1214 = fVar51;
      fStack_1210 = fVar51;
      fStack_120c = fVar51;
      fStack_1208 = fVar51;
      fStack_1204 = fVar51;
      fStack_1200 = fVar51;
      fStack_11fc = fVar51;
      local_14b0 = ray;
      fVar61 = fVar51;
      fVar62 = fVar51;
      fVar63 = fVar51;
      fVar64 = fVar51;
      fVar65 = fVar51;
      fVar66 = fVar51;
LAB_01c5cacb:
      if (puVar22 != local_11d8) {
        uVar25 = puVar22[-1];
        puVar22 = puVar22 + -1;
        while ((uVar25 & 8) == 0) {
          auVar48 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar25 + 0x40 + local_1478),
                                    auVar69._0_32_);
          auVar48 = vmulps_avx512vl(auVar72._0_32_,auVar48);
          auVar49 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar23),auVar70._0_32_);
          auVar49 = vmulps_avx512vl(auVar73._0_32_,auVar49);
          auVar48 = vmaxps_avx(auVar48,auVar49);
          auVar49 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar21),auVar71._0_32_);
          auVar50._4_4_ = auVar60._4_4_ * auVar49._4_4_;
          auVar50._0_4_ = auVar60._0_4_ * auVar49._0_4_;
          auVar50._8_4_ = auVar60._8_4_ * auVar49._8_4_;
          auVar50._12_4_ = auVar60._12_4_ * auVar49._12_4_;
          auVar50._16_4_ = auVar60._16_4_ * auVar49._16_4_;
          auVar50._20_4_ = auVar60._20_4_ * auVar49._20_4_;
          auVar50._24_4_ = auVar60._24_4_ * auVar49._24_4_;
          auVar50._28_4_ = auVar49._28_4_;
          auVar49 = vmaxps_avx(auVar50,auVar54._0_32_);
          auVar48 = vmaxps_avx(auVar48,auVar49);
          auVar49 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar24),auVar69._0_32_);
          auVar14._4_4_ = fVar61 * auVar49._4_4_;
          auVar14._0_4_ = fVar51 * auVar49._0_4_;
          auVar14._8_4_ = fVar62 * auVar49._8_4_;
          auVar14._12_4_ = fVar63 * auVar49._12_4_;
          auVar14._16_4_ = fVar64 * auVar49._16_4_;
          auVar14._20_4_ = fVar65 * auVar49._20_4_;
          auVar14._24_4_ = fVar66 * auVar49._24_4_;
          auVar14._28_4_ = auVar49._28_4_;
          auVar49 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar23 ^ 0x20)),
                                    auVar70._0_32_);
          auVar15._4_4_ = auVar55._4_4_ * auVar49._4_4_;
          auVar15._0_4_ = auVar55._0_4_ * auVar49._0_4_;
          auVar15._8_4_ = auVar55._8_4_ * auVar49._8_4_;
          auVar15._12_4_ = auVar55._12_4_ * auVar49._12_4_;
          auVar15._16_4_ = auVar55._16_4_ * auVar49._16_4_;
          auVar15._20_4_ = auVar55._20_4_ * auVar49._20_4_;
          auVar15._24_4_ = auVar55._24_4_ * auVar49._24_4_;
          auVar15._28_4_ = auVar49._28_4_;
          auVar49 = vminps_avx(auVar14,auVar15);
          auVar50 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar21 ^ 0x20)),
                                    auVar71._0_32_);
          auVar16._4_4_ = auVar58._4_4_ * auVar50._4_4_;
          auVar16._0_4_ = auVar58._0_4_ * auVar50._0_4_;
          auVar16._8_4_ = auVar58._8_4_ * auVar50._8_4_;
          auVar16._12_4_ = auVar58._12_4_ * auVar50._12_4_;
          auVar16._16_4_ = auVar58._16_4_ * auVar50._16_4_;
          auVar16._20_4_ = auVar58._20_4_ * auVar50._20_4_;
          auVar16._24_4_ = auVar58._24_4_ * auVar50._24_4_;
          auVar16._28_4_ = auVar50._28_4_;
          auVar50 = vminps_avx(auVar16,auVar57._0_32_);
          auVar49 = vminps_avx(auVar49,auVar50);
          uVar20 = vcmpps_avx512vl(auVar48,auVar49,2);
          if ((char)uVar20 == '\0') goto LAB_01c5cacb;
          uVar17 = uVar25 & 0xfffffffffffffff0;
          lVar18 = 0;
          for (uVar25 = uVar20; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar25 = *(ulong *)(uVar17 + lVar18 * 8);
          uVar19 = (uint)uVar20 - 1 & (uint)uVar20;
          uVar20 = (ulong)uVar19;
          if (uVar19 != 0) {
            do {
              *puVar22 = uVar25;
              puVar22 = puVar22 + 1;
              lVar18 = 0;
              for (uVar25 = uVar20; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                lVar18 = lVar18 + 1;
              }
              uVar20 = uVar20 - 1 & uVar20;
              uVar25 = *(ulong *)(uVar17 + lVar18 * 8);
            } while (uVar20 != 0);
          }
        }
        local_1460 = (ulong)((uint)uVar25 & 0xf) - 8;
        uVar25 = uVar25 & 0xfffffffffffffff0;
        for (local_1468 = 0; local_1468 != local_1460; local_1468 = local_1468 + 1) {
          lVar18 = local_1468 * 0x50;
          local_1480 = context->scene;
          ppfVar4 = (local_1480->vertices).items;
          pfVar5 = ppfVar4[*(uint *)(uVar25 + 0x30 + lVar18)];
          pfVar6 = ppfVar4[*(uint *)(uVar25 + 0x34 + lVar18)];
          pfVar7 = ppfVar4[*(uint *)(uVar25 + 0x38 + lVar18)];
          pfVar8 = ppfVar4[*(uint *)(uVar25 + 0x3c + lVar18)];
          auVar27 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar25 + lVar18)),
                                  *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar25 + 8 + lVar18)));
          auVar47 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar25 + lVar18)),
                                  *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar25 + 8 + lVar18)));
          auVar28 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar25 + 4 + lVar18)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar25 + 0xc + lVar18)))
          ;
          auVar26 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar25 + 4 + lVar18)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar25 + 0xc + lVar18)))
          ;
          auVar29 = vunpcklps_avx(auVar47,auVar26);
          auVar31 = vunpcklps_avx(auVar27,auVar28);
          auVar26 = vunpckhps_avx(auVar27,auVar28);
          auVar28 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar25 + 0x10 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar25 + 0x18 + lVar18)));
          auVar47 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar25 + 0x10 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar25 + 0x18 + lVar18)));
          auVar30 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar25 + 0x14 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar25 + 0x1c + lVar18)));
          auVar27 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar25 + 0x14 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar25 + 0x1c + lVar18)));
          auVar34 = vunpcklps_avx(auVar47,auVar27);
          auVar32 = vunpcklps_avx(auVar28,auVar30);
          auVar27 = vunpckhps_avx(auVar28,auVar30);
          auVar30 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar25 + 0x20 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar25 + 0x28 + lVar18)));
          auVar47 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar25 + 0x20 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar25 + 0x28 + lVar18)));
          auVar33 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar25 + 0x24 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar25 + 0x2c + lVar18)));
          auVar28 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar25 + 0x24 + lVar18))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar25 + 0x2c + lVar18)));
          auVar36 = vunpcklps_avx(auVar47,auVar28);
          auVar35 = vunpcklps_avx(auVar30,auVar33);
          auVar28 = vunpckhps_avx(auVar30,auVar33);
          puVar1 = (undefined8 *)(uVar25 + 0x30 + lVar18);
          local_13e8 = *puVar1;
          uStack_13e0 = puVar1[1];
          puVar1 = (undefined8 *)(uVar25 + 0x40 + lVar18);
          local_13f8 = *puVar1;
          uStack_13f0 = puVar1[1];
          uVar2 = *(undefined4 *)&(local_14b0->org).field_0;
          auVar37._4_4_ = uVar2;
          auVar37._0_4_ = uVar2;
          auVar37._8_4_ = uVar2;
          auVar37._12_4_ = uVar2;
          uVar2 = *(undefined4 *)((long)&(local_14b0->org).field_0 + 4);
          auVar38._4_4_ = uVar2;
          auVar38._0_4_ = uVar2;
          auVar38._8_4_ = uVar2;
          auVar38._12_4_ = uVar2;
          auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(local_14b0->org).field_0.m128[2]));
          uVar2 = *(undefined4 *)&(local_14b0->dir).field_0;
          auVar56._4_4_ = uVar2;
          auVar56._0_4_ = uVar2;
          auVar56._8_4_ = uVar2;
          auVar56._12_4_ = uVar2;
          uVar2 = *(undefined4 *)((long)&(local_14b0->dir).field_0 + 4);
          auVar59._4_4_ = uVar2;
          auVar59._0_4_ = uVar2;
          auVar59._8_4_ = uVar2;
          auVar59._12_4_ = uVar2;
          local_14b9 = 0;
          fVar61 = (local_14b0->dir).field_0.m128[2];
          auVar67._4_4_ = fVar61;
          auVar67._0_4_ = fVar61;
          auVar67._8_4_ = fVar61;
          auVar67._12_4_ = fVar61;
          auVar47 = vsubps_avx(auVar31,auVar37);
          auVar26 = vsubps_avx(auVar26,auVar38);
          auVar31 = vsubps_avx512vl(auVar29,auVar30);
          auVar32 = vsubps_avx512vl(auVar32,auVar37);
          auVar33 = vsubps_avx512vl(auVar27,auVar38);
          auVar34 = vsubps_avx512vl(auVar34,auVar30);
          auVar27 = vsubps_avx(auVar35,auVar37);
          auVar35 = vsubps_avx512vl(auVar28,auVar38);
          auVar30 = vsubps_avx512vl(auVar36,auVar30);
          auVar28 = vsubps_avx(auVar27,auVar47);
          auVar36 = vsubps_avx512vl(auVar35,auVar26);
          auVar37 = vsubps_avx512vl(auVar30,auVar31);
          auVar38 = vsubps_avx512vl(auVar47,auVar32);
          auVar39 = vsubps_avx512vl(auVar26,auVar33);
          auVar40 = vsubps_avx512vl(auVar31,auVar34);
          auVar41 = vsubps_avx512vl(auVar32,auVar27);
          auVar42 = vsubps_avx512vl(auVar33,auVar35);
          auVar43 = vsubps_avx512vl(auVar34,auVar30);
          auVar46._0_4_ = auVar27._0_4_ + auVar47._0_4_;
          auVar46._4_4_ = auVar27._4_4_ + auVar47._4_4_;
          auVar46._8_4_ = auVar27._8_4_ + auVar47._8_4_;
          auVar46._12_4_ = auVar27._12_4_ + auVar47._12_4_;
          auVar29 = vaddps_avx512vl(auVar35,auVar26);
          auVar44 = vaddps_avx512vl(auVar30,auVar31);
          auVar45 = vmulps_avx512vl(auVar29,auVar37);
          auVar45 = vfmsub231ps_avx512vl(auVar45,auVar36,auVar44);
          auVar44 = vmulps_avx512vl(auVar44,auVar28);
          auVar44 = vfmsub231ps_avx512vl(auVar44,auVar37,auVar46);
          auVar52._0_4_ = auVar36._0_4_ * auVar46._0_4_;
          auVar52._4_4_ = auVar36._4_4_ * auVar46._4_4_;
          auVar52._8_4_ = auVar36._8_4_ * auVar46._8_4_;
          auVar52._12_4_ = auVar36._12_4_ * auVar46._12_4_;
          auVar29 = vfmsub231ps_fma(auVar52,auVar28,auVar29);
          auVar53._0_4_ = fVar61 * auVar29._0_4_;
          auVar53._4_4_ = fVar61 * auVar29._4_4_;
          auVar53._8_4_ = fVar61 * auVar29._8_4_;
          auVar53._12_4_ = fVar61 * auVar29._12_4_;
          auVar29 = vfmadd231ps_avx512vl(auVar53,auVar59,auVar44);
          local_13d8 = vfmadd231ps_avx512vl(auVar29,auVar56,auVar45);
          auVar29 = vaddps_avx512vl(auVar47,auVar32);
          auVar44 = vaddps_avx512vl(auVar26,auVar33);
          auVar45 = vaddps_avx512vl(auVar31,auVar34);
          auVar46 = vmulps_avx512vl(auVar44,auVar40);
          auVar46 = vfmsub231ps_avx512vl(auVar46,auVar39,auVar45);
          auVar45 = vmulps_avx512vl(auVar45,auVar38);
          auVar45 = vfmsub231ps_avx512vl(auVar45,auVar40,auVar29);
          auVar29 = vmulps_avx512vl(auVar29,auVar39);
          auVar29 = vfmsub231ps_avx512vl(auVar29,auVar38,auVar44);
          auVar44._0_4_ = fVar61 * auVar29._0_4_;
          auVar44._4_4_ = fVar61 * auVar29._4_4_;
          auVar44._8_4_ = fVar61 * auVar29._8_4_;
          auVar44._12_4_ = fVar61 * auVar29._12_4_;
          auVar29 = vfmadd231ps_avx512vl(auVar44,auVar59,auVar45);
          local_13c8 = vfmadd231ps_avx512vl(auVar29,auVar56,auVar46);
          auVar29 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar27 = vaddps_avx512vl(auVar32,auVar27);
          auVar32 = vaddps_avx512vl(auVar33,auVar35);
          auVar30 = vaddps_avx512vl(auVar34,auVar30);
          auVar34 = vmulps_avx512vl(auVar32,auVar43);
          auVar34 = vfmsub231ps_avx512vl(auVar34,auVar42,auVar30);
          auVar30 = vmulps_avx512vl(auVar30,auVar41);
          auVar30 = vfmsub231ps_avx512vl(auVar30,auVar43,auVar27);
          auVar33._0_4_ = auVar27._0_4_ * auVar42._0_4_;
          auVar33._4_4_ = auVar27._4_4_ * auVar42._4_4_;
          auVar33._8_4_ = auVar27._8_4_ * auVar42._8_4_;
          auVar33._12_4_ = auVar27._12_4_ * auVar42._12_4_;
          auVar27 = vfmsub231ps_avx512vl(auVar33,auVar41,auVar32);
          auVar27 = vmulps_avx512vl(auVar67,auVar27);
          auVar27 = vfmadd231ps_avx512vl(auVar27,auVar59,auVar30);
          auVar27 = vfmadd231ps_avx512vl(auVar27,auVar56,auVar34);
          auVar32._0_4_ = local_13d8._0_4_ + local_13c8._0_4_;
          auVar32._4_4_ = local_13d8._4_4_ + local_13c8._4_4_;
          auVar32._8_4_ = local_13d8._8_4_ + local_13c8._8_4_;
          auVar32._12_4_ = local_13d8._12_4_ + local_13c8._12_4_;
          local_13b8 = vaddps_avx512vl(auVar27,auVar32);
          auVar32 = vandps_avx512vl(local_13b8,auVar29);
          auVar30._8_4_ = 0x34000000;
          auVar30._0_8_ = 0x3400000034000000;
          auVar30._12_4_ = 0x34000000;
          auVar30 = vmulps_avx512vl(auVar32,auVar30);
          auVar34 = vminps_avx512vl(local_13d8,local_13c8);
          auVar33 = vminps_avx512vl(auVar34,auVar27);
          auVar34._8_4_ = 0x80000000;
          auVar34._0_8_ = 0x8000000080000000;
          auVar34._12_4_ = 0x80000000;
          auVar34 = vxorps_avx512vl(auVar30,auVar34);
          uVar10 = vcmpps_avx512vl(auVar33,auVar34,5);
          auVar34 = vmaxps_avx512vl(local_13d8,local_13c8);
          auVar27 = vmaxps_avx512vl(auVar34,auVar27);
          uVar11 = vcmpps_avx512vl(auVar27,auVar30,2);
          local_13a0 = ((byte)uVar10 | (byte)uVar11) & 0xf;
          if (local_13a0 != 0) {
            auVar27 = vmulps_avx512vl(auVar37,auVar39);
            auVar30 = vmulps_avx512vl(auVar28,auVar40);
            auVar34 = vmulps_avx512vl(auVar36,auVar38);
            auVar33 = vmulps_avx512vl(auVar40,auVar42);
            auVar35 = vmulps_avx512vl(auVar38,auVar43);
            auVar44 = vmulps_avx512vl(auVar39,auVar41);
            auVar36 = vfmsub213ps_avx512vl(auVar36,auVar40,auVar27);
            auVar37 = vfmsub213ps_avx512vl(auVar37,auVar38,auVar30);
            auVar28 = vfmsub213ps_avx512vl(auVar28,auVar39,auVar34);
            auVar39 = vfmsub213ps_avx512vl(auVar43,auVar39,auVar33);
            auVar40 = vfmsub213ps_avx512vl(auVar41,auVar40,auVar35);
            auVar38 = vfmsub213ps_avx512vl(auVar42,auVar38,auVar44);
            auVar27 = vandps_avx512vl(auVar27,auVar29);
            auVar33 = vandps_avx512vl(auVar33,auVar29);
            uVar20 = vcmpps_avx512vl(auVar27,auVar33,1);
            auVar27 = vandps_avx512vl(auVar30,auVar29);
            auVar30 = vandps_avx512vl(auVar35,auVar29);
            uVar17 = vcmpps_avx512vl(auVar27,auVar30,1);
            auVar27 = vandps_avx512vl(auVar34,auVar29);
            auVar29 = vandps_avx512vl(auVar44,auVar29);
            uVar12 = vcmpps_avx512vl(auVar27,auVar29,1);
            bVar9 = (bool)((byte)uVar20 & 1);
            local_1368._0_4_ = (uint)bVar9 * auVar36._0_4_ | (uint)!bVar9 * auVar39._0_4_;
            bVar9 = (bool)((byte)(uVar20 >> 1) & 1);
            local_1368._4_4_ = (uint)bVar9 * auVar36._4_4_ | (uint)!bVar9 * auVar39._4_4_;
            bVar9 = (bool)((byte)(uVar20 >> 2) & 1);
            local_1368._8_4_ = (uint)bVar9 * auVar36._8_4_ | (uint)!bVar9 * auVar39._8_4_;
            bVar9 = (bool)((byte)(uVar20 >> 3) & 1);
            local_1368._12_4_ = (uint)bVar9 * auVar36._12_4_ | (uint)!bVar9 * auVar39._12_4_;
            bVar9 = (bool)((byte)uVar17 & 1);
            local_1358._0_4_ = (uint)bVar9 * auVar37._0_4_ | (uint)!bVar9 * auVar40._0_4_;
            bVar9 = (bool)((byte)(uVar17 >> 1) & 1);
            local_1358._4_4_ = (uint)bVar9 * auVar37._4_4_ | (uint)!bVar9 * auVar40._4_4_;
            bVar9 = (bool)((byte)(uVar17 >> 2) & 1);
            local_1358._8_4_ = (uint)bVar9 * auVar37._8_4_ | (uint)!bVar9 * auVar40._8_4_;
            bVar9 = (bool)((byte)(uVar17 >> 3) & 1);
            local_1358._12_4_ = (uint)bVar9 * auVar37._12_4_ | (uint)!bVar9 * auVar40._12_4_;
            bVar9 = (bool)((byte)uVar12 & 1);
            local_1348._0_4_ = (float)((uint)bVar9 * auVar28._0_4_ | (uint)!bVar9 * auVar38._0_4_);
            bVar9 = (bool)((byte)(uVar12 >> 1) & 1);
            local_1348._4_4_ = (float)((uint)bVar9 * auVar28._4_4_ | (uint)!bVar9 * auVar38._4_4_);
            bVar9 = (bool)((byte)(uVar12 >> 2) & 1);
            local_1348._8_4_ = (float)((uint)bVar9 * auVar28._8_4_ | (uint)!bVar9 * auVar38._8_4_);
            bVar9 = (bool)((byte)(uVar12 >> 3) & 1);
            local_1348._12_4_ =
                 (float)((uint)bVar9 * auVar28._12_4_ | (uint)!bVar9 * auVar38._12_4_);
            auVar41._0_4_ = fVar61 * local_1348._0_4_;
            auVar41._4_4_ = fVar61 * local_1348._4_4_;
            auVar41._8_4_ = fVar61 * local_1348._8_4_;
            auVar41._12_4_ = fVar61 * local_1348._12_4_;
            auVar27 = vfmadd213ps_fma(auVar59,local_1358,auVar41);
            auVar27 = vfmadd213ps_fma(auVar56,local_1368,auVar27);
            auVar39._0_4_ = auVar27._0_4_ + auVar27._0_4_;
            auVar39._4_4_ = auVar27._4_4_ + auVar27._4_4_;
            auVar39._8_4_ = auVar27._8_4_ + auVar27._8_4_;
            auVar39._12_4_ = auVar27._12_4_ + auVar27._12_4_;
            auVar40._0_4_ = auVar31._0_4_ * local_1348._0_4_;
            auVar40._4_4_ = auVar31._4_4_ * local_1348._4_4_;
            auVar40._8_4_ = auVar31._8_4_ * local_1348._8_4_;
            auVar40._12_4_ = auVar31._12_4_ * local_1348._12_4_;
            auVar26 = vfmadd213ps_fma(auVar26,local_1358,auVar40);
            auVar26 = vfmadd213ps_fma(auVar47,local_1368,auVar26);
            auVar47 = vrcp14ps_avx512vl(auVar39);
            auVar28 = auVar68._0_16_;
            auVar27 = vfnmadd213ps_avx512vl(auVar47,auVar39,auVar28);
            auVar47 = vfmadd132ps_fma(auVar27,auVar47,auVar47);
            local_1378._0_4_ = auVar47._0_4_ * (auVar26._0_4_ + auVar26._0_4_);
            local_1378._4_4_ = auVar47._4_4_ * (auVar26._4_4_ + auVar26._4_4_);
            local_1378._8_4_ = auVar47._8_4_ * (auVar26._8_4_ + auVar26._8_4_);
            local_1378._12_4_ = auVar47._12_4_ * (auVar26._12_4_ + auVar26._12_4_);
            uVar2 = *(undefined4 *)((long)&(local_14b0->org).field_0 + 0xc);
            auVar47._4_4_ = uVar2;
            auVar47._0_4_ = uVar2;
            auVar47._8_4_ = uVar2;
            auVar47._12_4_ = uVar2;
            uVar10 = vcmpps_avx512vl(local_1378,auVar47,0xd);
            auVar36._8_4_ = 0x80000000;
            auVar36._0_8_ = 0x8000000080000000;
            auVar36._12_4_ = 0x80000000;
            auVar47 = vxorps_avx512vl(auVar39,auVar36);
            fVar61 = local_14b0->tfar;
            auVar35._4_4_ = fVar61;
            auVar35._0_4_ = fVar61;
            auVar35._8_4_ = fVar61;
            auVar35._12_4_ = fVar61;
            uVar11 = vcmpps_avx512vl(local_1378,auVar35,2);
            uVar13 = vcmpps_avx512vl(auVar39,auVar47,4);
            local_13a0 = (byte)uVar10 & (byte)uVar11 & (byte)uVar13 & local_13a0;
            if (local_13a0 != 0) {
              auVar42._8_4_ = 0x219392ef;
              auVar42._0_8_ = 0x219392ef219392ef;
              auVar42._12_4_ = 0x219392ef;
              uVar20 = vcmpps_avx512vl(auVar32,auVar42,5);
              auVar47 = vrcp14ps_avx512vl(local_13b8);
              auVar26 = vfnmadd213ps_avx512vl(local_13b8,auVar47,auVar28);
              auVar47 = vfmadd132ps_avx512vl(auVar26,auVar47,auVar47);
              fVar64 = (float)((uint)((byte)uVar20 & 1) * auVar47._0_4_);
              fVar63 = (float)((uint)((byte)(uVar20 >> 1) & 1) * auVar47._4_4_);
              fVar62 = (float)((uint)((byte)(uVar20 >> 2) & 1) * auVar47._8_4_);
              fVar61 = (float)((uint)((byte)(uVar20 >> 3) & 1) * auVar47._12_4_);
              local_13a8 = &local_14b9;
              auVar43._0_4_ = fVar64 * local_13d8._0_4_;
              auVar43._4_4_ = fVar63 * local_13d8._4_4_;
              auVar43._8_4_ = fVar62 * local_13d8._8_4_;
              auVar43._12_4_ = fVar61 * local_13d8._12_4_;
              local_1398 = vminps_avx512vl(auVar43,auVar28);
              auVar45._0_4_ = fVar64 * local_13c8._0_4_;
              auVar45._4_4_ = fVar63 * local_13c8._4_4_;
              auVar45._8_4_ = fVar62 * local_13c8._8_4_;
              auVar45._12_4_ = fVar61 * local_13c8._12_4_;
              local_1388 = vminps_avx512vl(auVar45,auVar28);
              local_1488 = (ulong)local_13a0;
              local_1470 = puVar22;
              do {
                local_1490 = 0;
                for (uVar20 = local_1488; (uVar20 & 1) == 0;
                    uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                  local_1490 = local_1490 + 1;
                }
                local_1440 = *(uint *)((long)&local_13e8 + local_1490 * 4);
                local_1498 = (local_1480->geometries).items[local_1440].ptr;
                if ((local_1498->mask & local_14b0->mask) == 0) {
                  local_1488 = local_1488 ^ 1L << (local_1490 & 0x3f);
                }
                else {
                  local_14a8 = local_14a0->args;
                  if ((local_14a0->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_1498->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01c5d372:
                    local_14b0->tfar = -INFINITY;
                    return;
                  }
                  local_1338 = auVar73._0_32_;
                  local_1318 = auVar72._0_32_;
                  local_12f8 = auVar71._0_32_;
                  local_12d8 = auVar70._0_32_;
                  local_12b8 = auVar69._0_32_;
                  uVar20 = (ulong)(uint)((int)local_1490 * 4);
                  local_1428.context = local_14a0->user;
                  local_1458 = *(undefined4 *)(local_1368 + uVar20);
                  local_1454 = *(undefined4 *)(local_1358 + uVar20);
                  local_1450 = *(undefined4 *)(local_1348 + uVar20);
                  local_144c = *(undefined4 *)(local_1398 + uVar20);
                  local_1448 = *(undefined4 *)(local_1388 + uVar20);
                  local_1444 = *(undefined4 *)((long)&local_13f8 + uVar20);
                  local_143c = (local_1428.context)->instID[0];
                  local_1438 = (local_1428.context)->instPrimID[0];
                  local_14b8 = local_14b0->tfar;
                  local_14b0->tfar = *(float *)(local_1378 + uVar20);
                  local_14b4 = -1;
                  local_1428.valid = &local_14b4;
                  local_1428.geometryUserPtr = local_1498->userPtr;
                  local_1428.hit = (RTCHitN *)&local_1458;
                  local_1428.N = 1;
                  local_1428.ray = (RTCRayN *)local_14b0;
                  if (((local_1498->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                      ((*local_1498->occlusionFilterN)(&local_1428), *local_1428.valid != 0)) &&
                     ((local_14a8->filter == (RTCFilterFunctionN)0x0 ||
                      ((((local_14a8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((local_1498->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*local_14a8->filter)(&local_1428), *local_1428.valid != 0))))))
                  goto LAB_01c5d372;
                  local_14b0->tfar = local_14b8;
                  local_1488 = local_1488 ^ 1L << (local_1490 & 0x3f);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar68 = ZEXT1664(auVar47);
                  auVar69 = ZEXT3264(local_12b8);
                  auVar70 = ZEXT3264(local_12d8);
                  auVar71 = ZEXT3264(local_12f8);
                  auVar72 = ZEXT3264(local_1318);
                  auVar73 = ZEXT3264(local_1338);
                  puVar22 = local_1470;
                }
              } while (local_1488 != 0);
            }
          }
          auVar60 = ZEXT3264(local_11f8);
          auVar55 = ZEXT3264(local_1238);
          auVar58 = ZEXT3264(local_1258);
          auVar54 = ZEXT3264(local_1278);
          auVar57 = ZEXT3264(local_1298);
          context = local_14a0;
          fVar51 = local_1218;
          fVar61 = fStack_1214;
          fVar62 = fStack_1210;
          fVar63 = fStack_120c;
          fVar64 = fStack_1208;
          fVar65 = fStack_1204;
          fVar66 = fStack_1200;
        }
        goto LAB_01c5cacb;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }